

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MassDensityR.cpp
# Opt level: O0

void __thiscall OpenMD::MassDensityR::process(MassDensityR *this)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *this_01;
  reference pvVar3;
  long *in_RDI;
  double dVar4;
  SelectionManager *pSVar5;
  int binNo;
  RealType mass;
  RealType distance;
  Vector3d pos;
  Vector3d CenterOfMass;
  int istep;
  int nFrames;
  DumpReader reader;
  int ii;
  StuntDouble *sd;
  Vector<double,_3U> *in_stack_ffffffffffffec88;
  DumpReader *in_stack_ffffffffffffec90;
  SelectionManager *in_stack_ffffffffffffec98;
  SelectionManager *in_stack_ffffffffffffeca0;
  int in_stack_ffffffffffffed1c;
  DumpReader *in_stack_ffffffffffffed20;
  Thermo *in_stack_ffffffffffffed38;
  int local_1288;
  string *in_stack_ffffffffffffeee0;
  SimInfo *in_stack_ffffffffffffeee8;
  DumpReader *in_stack_ffffffffffffeef0;
  DumpReader *local_10;
  
  DumpReader::DumpReader
            (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee0);
  iVar2 = DumpReader::getNFrames(in_stack_ffffffffffffec90);
  *(int *)(in_RDI + 0x1a) = iVar2 / (int)in_RDI[6];
  for (local_1288 = 0; local_1288 < iVar2; local_1288 = (int)in_RDI[6] + local_1288) {
    DumpReader::readFrame(in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c);
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    this_01 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)this_01;
    Thermo::getCom(in_stack_ffffffffffffed38);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    if (bVar1) {
      SelectionEvaluator::evaluate((SelectionEvaluator *)this_01);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffeca0,(SelectionSet *)in_stack_ffffffffffffec98);
      SelectionSet::~SelectionSet((SelectionSet *)0x17cc4e);
    }
    local_10 = (DumpReader *)
               SelectionManager::beginSelected
                         (in_stack_ffffffffffffeca0,(int *)in_stack_ffffffffffffec98);
    while (local_10 != (DumpReader *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffec98);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffec98,
                        (Vector<double,_3U> *)in_stack_ffffffffffffec90);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_ffffffffffffec90,in_stack_ffffffffffffec88);
      dVar4 = Vector<double,_3U>::length((Vector<double,_3U> *)0x17cd1f);
      pSVar5 = (SelectionManager *)StuntDouble::getMass((StuntDouble *)local_10);
      in_stack_ffffffffffffeca0 = pSVar5;
      if (dVar4 < (double)in_RDI[0xe3]) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe8),
                            (long)(int)(dVar4 / (double)in_RDI[0xe4]));
        *pvVar3 = (double)pSVar5 + *pvVar3;
        in_stack_ffffffffffffec98 = pSVar5;
      }
      in_stack_ffffffffffffec90 =
           (DumpReader *)
           SelectionManager::nextSelected
                     (in_stack_ffffffffffffeca0,(int *)in_stack_ffffffffffffec98);
      local_10 = in_stack_ffffffffffffec90;
    }
  }
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::~DumpReader(in_stack_ffffffffffffec90);
  return;
}

Assistant:

void MassDensityR::process() {
    StuntDouble* sd;
    int ii;

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Vector3d CenterOfMass = thermo_.getCom();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which StuntDouble belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos      = CenterOfMass - sd->getPos();
        RealType distance = pos.length();
        RealType mass     = sd->getMass();

        if (distance < len_) {
          int binNo = int(distance / deltaR_);
          massR_[binNo] += mass;
        }
      }
    }
    writeMassDensityR();
  }